

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall
anon_unknown.dwarf_145302::SwiftCompilerTool::createCustomCommand
          (SwiftCompilerTool *this,BuildKey *key)

{
  BuildKey *in_RDX;
  bool local_e1;
  unique_ptr<(anonymous_namespace)::SwiftGetVersionCommand,_std::default_delete<(anonymous_namespace)::SwiftGetVersionCommand>_>
  local_c0;
  char *local_b8 [2];
  StringRef local_a8;
  BuildKey *local_98;
  BuildKey *key_local;
  SwiftCompilerTool *this_local;
  char *local_80;
  size_t local_78;
  char *local_70;
  size_t local_68;
  char *local_60;
  size_t local_58;
  char **local_50;
  char *local_48;
  size_t local_40;
  size_t local_38;
  char *local_30;
  char *local_28;
  int local_1c;
  char *local_18;
  char **local_10;
  
  local_98 = in_RDX;
  key_local = key;
  this_local = this;
  local_a8 = llbuild::buildsystem::BuildKey::getCustomTaskName(in_RDX);
  local_10 = local_b8;
  local_18 = "swift-get-version";
  local_b8[0] = "swift-get-version";
  local_78 = strlen("swift-get-version");
  local_60 = local_a8.Data;
  local_58 = local_a8.Length;
  local_70 = local_b8[0];
  local_80 = local_b8[0];
  local_48 = local_b8[0];
  local_50 = &local_60;
  local_e1 = false;
  local_68 = local_78;
  local_40 = local_78;
  if (local_a8.Length == local_78) {
    local_28 = local_a8.Data;
    local_30 = local_b8[0];
    local_38 = local_78;
    if (local_78 == 0) {
      local_1c = 0;
    }
    else {
      local_1c = memcmp(local_a8.Data,local_b8[0],local_78);
    }
    local_e1 = local_1c == 0;
  }
  if (local_e1) {
    llvm::
    make_unique<(anonymous_namespace)::SwiftGetVersionCommand,llbuild::buildsystem::BuildKey_const&>
              ((llvm *)&local_c0,local_98);
    std::
    unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>::
    unique_ptr<(anonymous_namespace)::SwiftGetVersionCommand,std::default_delete<(anonymous_namespace)::SwiftGetVersionCommand>,void>
              ((unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>
                *)this,&local_c0);
    std::
    unique_ptr<(anonymous_namespace)::SwiftGetVersionCommand,_std::default_delete<(anonymous_namespace)::SwiftGetVersionCommand>_>
    ::~unique_ptr(&local_c0);
  }
  else {
    std::
    unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>::
    unique_ptr<std::default_delete<llbuild::buildsystem::Command>,void>
              ((unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>
                *)this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCustomCommand(
      const BuildKey& key) override {
    if (key.getCustomTaskName() == "swift-get-version" ) {
      return llvm::make_unique<SwiftGetVersionCommand>(key);
    }

    return nullptr;
  }